

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O2

int x509_verify_param_copy(X509_VERIFY_PARAM *dest,X509_VERIFY_PARAM *src,int prefer_src)

{
  int iVar1;
  stack_st_OPENSSL_STRING *psVar2;
  
  if (src == (X509_VERIFY_PARAM *)0x0) {
    return 1;
  }
  if ((src->purpose != 0) && (prefer_src != 0 || dest->purpose == 0)) {
    dest->purpose = src->purpose;
  }
  if ((src->trust != 0) && (prefer_src != 0 || dest->trust == 0)) {
    dest->trust = src->trust;
  }
  if ((src->depth != -1) && (prefer_src != 0 || dest->depth == -1)) {
    dest->depth = src->depth;
  }
  if ((dest->flags & 2) == 0) {
    dest->check_time = src->check_time;
  }
  dest->flags = dest->flags | src->flags;
  if (((src->policies == (stack_st_ASN1_OBJECT *)0x0) ||
      (prefer_src == 0 && dest->policies != (stack_st_ASN1_OBJECT *)0x0)) ||
     (iVar1 = X509_VERIFY_PARAM_set1_policies
                        ((X509_VERIFY_PARAM *)dest,(stack_st_ASN1_OBJECT *)src->policies),
     iVar1 != 0)) {
    if ((src->hosts != (stack_st_OPENSSL_STRING *)0x0) &&
       (prefer_src != 0 || dest->hosts == (stack_st_OPENSSL_STRING *)0x0)) {
      sk_OPENSSL_STRING_pop_free(dest->hosts,str_free);
      dest->hosts = (stack_st_OPENSSL_STRING *)0x0;
      if (src->hosts != (stack_st_OPENSSL_STRING *)0x0) {
        psVar2 = sk_OPENSSL_STRING_deep_copy(src->hosts,OPENSSL_strdup,str_free);
        dest->hosts = psVar2;
        if (psVar2 == (stack_st_OPENSSL_STRING *)0x0) {
          return 0;
        }
        dest->hostflags = src->hostflags;
      }
    }
    if (((src->email == (char *)0x0) || (prefer_src == 0 && dest->email != (char *)0x0)) ||
       (iVar1 = X509_VERIFY_PARAM_set1_email(dest,src->email,src->emaillen), iVar1 != 0)) {
      if (((src->ip == (uchar *)0x0) || (prefer_src == 0 && dest->ip != (uchar *)0x0)) ||
         (iVar1 = X509_VERIFY_PARAM_set1_ip(dest,src->ip,src->iplen), iVar1 != 0)) {
        dest->poison = src->poison;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int x509_verify_param_copy(X509_VERIFY_PARAM *dest,
                                  const X509_VERIFY_PARAM *src,
                                  int prefer_src) {
  if (src == NULL) {
    return 1;
  }

  copy_int_param(&dest->purpose, &src->purpose, /*default_val=*/0, prefer_src);
  copy_int_param(&dest->trust, &src->trust, /*default_val=*/0, prefer_src);
  copy_int_param(&dest->depth, &src->depth, /*default_val=*/-1, prefer_src);

  // |check_time|, unlike all other parameters, does not honor |prefer_src|.
  // This means |X509_VERIFY_PARAM_set1| will not overwrite it. This behavior
  // comes from OpenSSL but may have been a bug.
  if (!(dest->flags & X509_V_FLAG_USE_CHECK_TIME)) {
    dest->check_time = src->check_time;
    // The source |X509_V_FLAG_USE_CHECK_TIME| flag, if set, is copied below.
  }

  dest->flags |= src->flags;

  if (should_copy(dest->policies != NULL, src->policies != NULL, prefer_src)) {
    if (!X509_VERIFY_PARAM_set1_policies(dest, src->policies)) {
      return 0;
    }
  }

  if (should_copy(dest->hosts != NULL, src->hosts != NULL, prefer_src)) {
    sk_OPENSSL_STRING_pop_free(dest->hosts, str_free);
    dest->hosts = NULL;
    if (src->hosts) {
      dest->hosts =
          sk_OPENSSL_STRING_deep_copy(src->hosts, OPENSSL_strdup, str_free);
      if (dest->hosts == NULL) {
        return 0;
      }
      // Copy the host flags if and only if we're copying the host list. Note
      // this means mechanisms like |X509_STORE_CTX_set_default| cannot be used
      // to set host flags. E.g. we cannot change the defaults using
      // |kDefaultParam| below.
      dest->hostflags = src->hostflags;
    }
  }

  if (should_copy(dest->email != NULL, src->email != NULL, prefer_src)) {
    if (!X509_VERIFY_PARAM_set1_email(dest, src->email, src->emaillen)) {
      return 0;
    }
  }

  if (should_copy(dest->ip != NULL, src->ip != NULL, prefer_src)) {
    if (!X509_VERIFY_PARAM_set1_ip(dest, src->ip, src->iplen)) {
      return 0;
    }
  }

  dest->poison = src->poison;
  return 1;
}